

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLSchemaDescriptionImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLSchemaDescriptionImpl::setTargetNamespace
          (XMLSchemaDescriptionImpl *this,XMLCh *newNamespace)

{
  MemoryManager *pMVar1;
  XMLCh *pXVar2;
  XMLCh *newNamespace_local;
  XMLSchemaDescriptionImpl *this_local;
  
  if (this->fNamespace != (XMLCh *)0x0) {
    pMVar1 = XMLGrammarDescription::getMemoryManager((XMLGrammarDescription *)this);
    (*pMVar1->_vptr_MemoryManager[4])(pMVar1,this->fNamespace);
    this->fNamespace = (XMLCh *)0x0;
  }
  pMVar1 = XMLGrammarDescription::getMemoryManager((XMLGrammarDescription *)this);
  pXVar2 = XMLString::replicate(newNamespace,pMVar1);
  this->fNamespace = pXVar2;
  return;
}

Assistant:

void XMLSchemaDescriptionImpl::setTargetNamespace(const XMLCh* const newNamespace)
{  
    if (fNamespace) {
        XMLGrammarDescription::getMemoryManager()->deallocate((void*)fNamespace);
        fNamespace = 0;
    }
    
    fNamespace = XMLString::replicate(newNamespace, XMLGrammarDescription::getMemoryManager()); 
}